

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextedit.cpp
# Opt level: O2

void __thiscall QTextEdit::changeEvent(QTextEdit *this,QEvent *e)

{
  short sVar1;
  QTextEditPrivate *this_00;
  QWidgetTextControl *pQVar2;
  bool bVar3;
  QTextDocument *pQVar4;
  QPalette *pQVar5;
  
  this_00 = *(QTextEditPrivate **)
             &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  QFrame::changeEvent((QFrame *)this,e);
  sVar1 = *(short *)(e + 8);
  switch(sVar1) {
  case 0x5b:
  case 0x5c:
  case 0x5d:
  case 0x5e:
  case 0x5f:
  case 0x60:
    break;
  case 0x61:
switchD_00461f42_caseD_61:
    pQVar4 = QWidgetTextControl::document((QWidgetTextControl *)this_00->control);
    QTextDocument::setDefaultFont((QFont *)pQVar4);
    return;
  case 0x62:
    (**(code **)(*(long *)e + 0x10))
              (e,(((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->
                  widget_attributes & 1) == 0);
    pQVar2 = (QWidgetTextControl *)this_00->control;
    pQVar5 = QWidget::palette((QWidget *)this);
    QWidgetTextControl::setPalette(pQVar2,pQVar5);
  case 0x5a:
    QTextEditPrivate::sendControlEvent(this_00,e);
    return;
  case 99:
    bVar3 = QWidget::isActiveWindow((QWidget *)this);
    if (!bVar3) {
      QBasicTimer::stop();
      return;
    }
    break;
  default:
    if (sVar1 == 0x27) {
      pQVar2 = (QWidgetTextControl *)this_00->control;
      pQVar5 = QWidget::palette((QWidget *)this);
      QWidgetTextControl::setPalette(pQVar2,pQVar5);
      return;
    }
    if (sVar1 == 0x24) goto switchD_00461f42_caseD_61;
  }
  return;
}

Assistant:

void QTextEdit::changeEvent(QEvent *e)
{
    Q_D(QTextEdit);
    QAbstractScrollArea::changeEvent(e);
    if (e->type() == QEvent::ApplicationFontChange
        || e->type() == QEvent::FontChange) {
        d->control->document()->setDefaultFont(font());
    }  else if (e->type() == QEvent::ActivationChange) {
        if (!isActiveWindow())
            d->autoScrollTimer.stop();
    } else if (e->type() == QEvent::EnabledChange) {
        e->setAccepted(isEnabled());
        d->control->setPalette(palette());
        d->sendControlEvent(e);
    } else if (e->type() == QEvent::PaletteChange) {
        d->control->setPalette(palette());
    } else if (e->type() == QEvent::LayoutDirectionChange) {
        d->sendControlEvent(e);
    }
}